

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

void __thiscall bitfoot::Bitfoot::AddPawnCaps<false,true>(Bitfoot *this,uint64_t dests)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  
  if ((dests != 0) && (uVar5 = this->pc[2], uVar5 != 0)) {
    uVar10 = this->pc[1];
    uVar9 = dests & uVar10 & uVar5 << 7 & 0x7f7f7f7f7f7f7f00;
    if (uVar9 != 0) {
      do {
        lVar1 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        uVar8 = (&_board)[lVar1];
        uVar10 = (ulong)uVar8;
        if ((uVar8 & 1) == 0) {
          __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0xb55,
                        "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                       );
        }
        uVar2 = (uint)lVar1;
        uVar6 = uVar2 - 7;
        if (0x3f < uVar6) goto LAB_00116fc9;
        uVar4 = (ulong)uVar6;
        if ((*(ulong *)(_BITMAP + uVar4 * 8) & this->pinned[0]) == 0) {
LAB_00116c68:
          bVar11 = 0xb < uVar8 - 2;
          if (uVar2 < 0x38) {
            if (bVar11 && uVar10 != 0) goto LAB_00116faa;
            iVar7 = *(int *)(_VALUE_OF + uVar10 * 4);
            iVar12 = 0;
          }
          else {
            if (bVar11 && uVar10 != 0) goto LAB_00116faa;
            AddMove<false,(bitfoot::MoveType)4>
                      (this,2,uVar6,uVar2,*(int *)(_VALUE_OF + uVar10 * 4) + 0x3cf,uVar8,10);
            uVar8 = (&_board)[lVar1];
            if (0xb < uVar8 - 2 && (ulong)uVar8 != 0) goto LAB_00116faa;
            AddMove<false,(bitfoot::MoveType)4>
                      (this,2,uVar6,uVar2,*(int *)(_VALUE_OF + (ulong)uVar8 * 4) + 500,uVar8,8);
            uVar8 = (&_board)[lVar1];
            if (0xb < uVar8 - 2 && (ulong)uVar8 != 0) goto LAB_00116faa;
            AddMove<false,(bitfoot::MoveType)4>
                      (this,2,uVar6,uVar2,*(int *)(_VALUE_OF + (ulong)uVar8 * 4) + 0x140,uVar8,6);
            uVar8 = (&_board)[lVar1];
            if (0xb < uVar8 - 2 && (ulong)uVar8 != 0) goto LAB_00116faa;
            iVar7 = *(int *)(_VALUE_OF + (ulong)uVar8 * 4) + 300;
            iVar12 = 4;
          }
          AddMove<false,(bitfoot::MoveType)4>(this,2,uVar6,uVar2,iVar7,uVar8,iVar12);
        }
        else if ((*(ulong *)(_BITMAP + lVar1 * 8) & this->pinned[0]) != 0) {
          iVar7 = 0;
          if ((this->king[0] | uVar6) < 0x40) {
            iVar7 = *(int *)(uVar4 * 0x100 + 0x1b2660 + (ulong)(uint)this->king[0] * 4);
          }
          iVar12 = -iVar7;
          if (0 < iVar7) {
            iVar12 = iVar7;
          }
          iVar7 = *(int *)(uVar4 * 0x100 + 0x1b2660 + lVar1 * 4);
          iVar3 = -iVar7;
          if (0 < iVar7) {
            iVar3 = iVar7;
          }
          if (iVar12 == iVar3) goto LAB_00116c68;
        }
        uVar9 = uVar9 & uVar9 - 1;
      } while (uVar9 != 0);
      uVar10 = this->pc[1];
      uVar5 = this->pc[2];
    }
    for (uVar10 = dests & uVar10 & uVar5 << 9 & 0xfefefefefefefe00; uVar10 != 0;
        uVar10 = uVar10 & uVar10 - 1) {
      lVar1 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar8 = (&_board)[lVar1];
      uVar9 = (ulong)uVar8;
      if ((uVar8 & 1) == 0) {
        __assert_fail("_board[to] && (COLOR_OF(_board[to]) == !color)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xb76,
                      "void bitfoot::Bitfoot::AddPawnCaps(const uint64_t) [color = false, under_promote = true]"
                     );
      }
      uVar2 = (uint)lVar1;
      uVar6 = uVar2 - 9;
      if (0x3f < uVar6) {
LAB_00116fc9:
        __assert_fail("IS_SQUARE(from)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0x2dd,
                      "bool bitfoot::Bitfoot::Pinned(const int, const int) const [color = false]");
      }
      uVar4 = (ulong)uVar6;
      if ((*(ulong *)(_BITMAP + uVar4 * 8) & this->pinned[0]) == 0) {
LAB_00116e66:
        bVar11 = 0xb < uVar8 - 2;
        if (uVar2 < 0x38) {
          if (bVar11 && uVar9 != 0) goto LAB_00116faa;
          iVar7 = *(int *)(_VALUE_OF + uVar9 * 4);
          iVar12 = 0;
        }
        else {
          if (bVar11 && uVar9 != 0) {
LAB_00116faa:
            __assert_fail("!piece || IS_PIECE(piece)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                          ,0xff,"static int bitfoot::Bitfoot::ValueOf(const int)");
          }
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar6,uVar2,*(int *)(_VALUE_OF + uVar9 * 4) + 0x3cf,uVar8,10);
          uVar8 = (&_board)[lVar1];
          if (0xb < uVar8 - 2 && (ulong)uVar8 != 0) goto LAB_00116faa;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar6,uVar2,*(int *)(_VALUE_OF + (ulong)uVar8 * 4) + 500,uVar8,8);
          uVar8 = (&_board)[lVar1];
          if (0xb < uVar8 - 2 && (ulong)uVar8 != 0) goto LAB_00116faa;
          AddMove<false,(bitfoot::MoveType)4>
                    (this,2,uVar6,uVar2,*(int *)(_VALUE_OF + (ulong)uVar8 * 4) + 0x140,uVar8,6);
          uVar8 = (&_board)[lVar1];
          if (0xb < uVar8 - 2 && (ulong)uVar8 != 0) goto LAB_00116faa;
          iVar7 = *(int *)(_VALUE_OF + (ulong)uVar8 * 4) + 300;
          iVar12 = 4;
        }
        AddMove<false,(bitfoot::MoveType)4>(this,2,uVar6,uVar2,iVar7,uVar8,iVar12);
      }
      else if ((*(ulong *)(_BITMAP + lVar1 * 8) & this->pinned[0]) != 0) {
        iVar7 = 0;
        if ((this->king[0] | uVar6) < 0x40) {
          iVar7 = *(int *)(uVar4 * 0x100 + 0x1b2660 + (ulong)(uint)this->king[0] * 4);
        }
        iVar12 = -iVar7;
        if (0 < iVar7) {
          iVar12 = iVar7;
        }
        iVar7 = *(int *)(uVar4 * 0x100 + 0x1b2660 + lVar1 * 4);
        iVar3 = -iVar7;
        if (0 < iVar7) {
          iVar3 = iVar7;
        }
        if (iVar12 == iVar3) goto LAB_00116e66;
      }
    }
  }
  return;
}

Assistant:

inline void AddPawnCaps(const uint64_t dests) {
    if (!dests || !pc[color|Pawn]) {
      return;
    }

    uint64_t dest;
    int from;
    int to;

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) >> 9) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[0]) << 7) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthEast : SouthEast));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }

    if (color) {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) >> 7) & pc[!color]);
    }
    else {
      dest = (dests & ((pc[color|Pawn] & ~_FILE[7]) << 9) & pc[!color]);
    }
    while (dest) {
      from = (PopLowSquare(dest, to) + (color ? NorthWest : SouthWest));
      assert(_board[to] && (COLOR_OF(_board[to]) == !color));
      if (!Pinned<color>(from, to)) {
        if (BIT(to) & _RANK[color ? 0 : 7]) {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      (ValueOf(_board[to]) + QueenValue),
                                      _board[to], (color|Queen));
          if (under_promote) {
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + RookValue),
                                        _board[to], (color|Rook));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + BishopValue),
                                        _board[to], (color|Bishop));
            AddMove<color, PawnCapture>((color|Pawn), from, to,
                                        (ValueOf(_board[to]) + KnightValue),
                                        _board[to], (color|Knight));
          }
        }
        else {
          AddMove<color, PawnCapture>((color|Pawn), from, to,
                                      ValueOf(_board[to]), _board[to], 0);
        }
      }
    }
  }